

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::iterate(DepthDrawCase *this)

{
  float fVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  deBool dVar10;
  RenderContext *pRVar11;
  undefined4 extraout_var;
  ShaderProgram *pSVar13;
  TestError *pTVar14;
  ObjectWrapper *this_00;
  reference pvVar15;
  float *pfVar16;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_01;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
  *this_02;
  undefined8 uVar17;
  bool bVar18;
  float fVar19;
  float local_194;
  float local_18c;
  PixelBufferAccess local_a0;
  float local_78;
  float local_74;
  float posPadding;
  float negPadding;
  int layerNdx;
  undefined1 local_60 [8];
  Random rnd;
  Surface viewport;
  GLint color2Location;
  GLint color1Location;
  GLint depthScaleLocation;
  GLint depthBiasLocation;
  GLint colLocation;
  GLint posLocation;
  Functions *gl;
  bool hasTessellation;
  DepthDrawCase *this_local;
  long lVar12;
  
  bVar18 = this->m_state == STATE_PER_PRIMITIVE;
  pRVar11 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar11->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar3);
  pcVar2 = *(code **)(lVar12 + 0x780);
  this_01 = &this->m_program;
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&this_01->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar4 = glu::ShaderProgram::getProgram(pSVar13);
  iVar3 = (*pcVar2)(dVar4,"a_position");
  pcVar2 = *(code **)(lVar12 + 0x780);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&this_01->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar4 = glu::ShaderProgram::getProgram(pSVar13);
  iVar5 = (*pcVar2)(dVar4,"a_colorMix");
  pcVar2 = *(code **)(lVar12 + 0xb48);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&this_01->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar4 = glu::ShaderProgram::getProgram(pSVar13);
  iVar6 = (*pcVar2)(dVar4,"u_depthBias");
  pcVar2 = *(code **)(lVar12 + 0xb48);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&this_01->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar4 = glu::ShaderProgram::getProgram(pSVar13);
  iVar7 = (*pcVar2)(dVar4,"u_depthScale");
  pcVar2 = *(code **)(lVar12 + 0xb48);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&this_01->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar4 = glu::ShaderProgram::getProgram(pSVar13);
  iVar8 = (*pcVar2)(dVar4,"u_color1");
  pcVar2 = *(code **)(lVar12 + 0xb48);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&this_01->
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar4 = glu::ShaderProgram::getProgram(pSVar13);
  iVar9 = (*pcVar2)(dVar4,"u_color2");
  tcu::Surface::Surface((Surface *)&rnd.m_rnd.z,0x100,0x100);
  de::Random::Random((Random *)local_60,0x213237);
  while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (iVar3 != -1))) {
    dVar10 = ::deGetFalse();
    if (dVar10 == 0) {
      while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (iVar5 != -1))) {
        dVar10 = ::deGetFalse();
        if (dVar10 == 0) {
          while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (iVar6 != -1))) {
            dVar10 = ::deGetFalse();
            if (dVar10 == 0) {
              while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (iVar7 != -1))) {
                dVar10 = ::deGetFalse();
                if (dVar10 == 0) {
                  while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (iVar8 != -1))) {
                    dVar10 = ::deGetFalse();
                    if (dVar10 == 0) {
                      while ((dVar10 = ::deGetFalse(), dVar10 == 0 && (iVar9 != -1))) {
                        dVar10 = ::deGetFalse();
                        if (dVar10 == 0) {
                          (**(code **)(lVar12 + 0x1a00))(0,0,0x100);
                          (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
                          (**(code **)(lVar12 + 0x1d0))(0x3f800000);
                          (**(code **)(lVar12 + 0x4a0))(0x201);
                          (**(code **)(lVar12 + 0x5e0))(0xb71);
                          (**(code **)(lVar12 + 0x188))(0x4100);
                          dVar4 = (**(code **)(lVar12 + 0x800))();
                          glu::checkError(dVar4,"setup viewport",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                                          ,0xf11);
                          pcVar2 = *(code **)(lVar12 + 0x40);
                          this_00 = &de::details::
                                     UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                                     ::operator*(&(this->m_vbo).
                                                  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                                                )->super_ObjectWrapper;
                          dVar4 = glu::ObjectWrapper::operator*(this_00);
                          (*pcVar2)(0x8892,dVar4);
                          (**(code **)(lVar12 + 0x19f0))(iVar3,4,0x1406,0,0x20,0);
                          (**(code **)(lVar12 + 0x19f0))(iVar5,4,0x1406,0,0x20,0x10);
                          (**(code **)(lVar12 + 0x610))(iVar3);
                          (**(code **)(lVar12 + 0x610))(iVar5);
                          pcVar2 = *(code **)(lVar12 + 0x1680);
                          pSVar13 = de::details::
                                    UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                    ::operator->(&(this->m_program).
                                                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                                );
                          dVar4 = glu::ShaderProgram::getProgram(pSVar13);
                          (*pcVar2)(dVar4);
                          dVar4 = (**(code **)(lVar12 + 0x800))();
                          glu::checkError(dVar4,"setup va",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                                          ,0xf19);
                          if (bVar18) {
                            (**(code **)(lVar12 + 0xfd8))(0x8e72,3);
                          }
                          for (posPadding = 0.0; (int)posPadding < this->m_numLayers;
                              posPadding = (float)((int)posPadding + 1)) {
                            pcVar2 = *(code **)(lVar12 + 0x14e0);
                            pvVar15 = std::
                                      vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                      ::operator[](&this->m_layers,(long)(int)posPadding);
                            (*pcVar2)(pvVar15->zOffset,iVar6);
                            pcVar2 = *(code **)(lVar12 + 0x14e0);
                            pvVar15 = std::
                                      vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                      ::operator[](&this->m_layers,(long)(int)posPadding);
                            (*pcVar2)(pvVar15->zScale,iVar7);
                            pcVar2 = *(code **)(lVar12 + 0x15a8);
                            pvVar15 = std::
                                      vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                      ::operator[](&this->m_layers,(long)(int)posPadding);
                            pfVar16 = tcu::Vector<float,_4>::getPtr(&pvVar15->color1);
                            (*pcVar2)(iVar8,1,pfVar16);
                            pcVar2 = *(code **)(lVar12 + 0x15a8);
                            pvVar15 = std::
                                      vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                      ::operator[](&this->m_layers,(long)(int)posPadding);
                            pfVar16 = tcu::Vector<float,_4>::getPtr(&pvVar15->color2);
                            (*pcVar2)(iVar9,1,pfVar16);
                            if (this->m_state == STATE_GLOBAL) {
                              if (this->m_bboxSize == BBOX_EQUAL) {
                                local_18c = 0.0;
                              }
                              else {
                                local_18c = de::Random::getFloat((Random *)local_60);
                                local_18c = local_18c * 0.3;
                              }
                              local_74 = local_18c;
                              if (this->m_bboxSize == BBOX_EQUAL) {
                                local_194 = 0.0;
                              }
                              else {
                                local_194 = de::Random::getFloat((Random *)local_60);
                                local_194 = local_194 * 0.3;
                              }
                              local_78 = local_194;
                              pcVar2 = *(code **)(lVar12 + 0x1040);
                              this_02 = &this->m_layers;
                              pvVar15 = std::
                                        vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                        ::operator[](this_02,(long)(int)posPadding);
                              fVar19 = pvVar15->zOffset - local_74;
                              pvVar15 = std::
                                        vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                        ::operator[](this_02,(long)(int)posPadding);
                              fVar1 = pvVar15->zOffset;
                              pvVar15 = std::
                                        vector<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                        ::operator[](this_02,(long)(int)posPadding);
                              (*pcVar2)(0xbf800000,0xbf800000,fVar19,0x3f800000,0x3f800000,
                                        0x3f800000,fVar1 + pvVar15->zScale + local_78);
                            }
                            uVar17 = 4;
                            if (bVar18) {
                              uVar17 = 0xe;
                            }
                            (**(code **)(lVar12 + 0x538))
                                      (uVar17,0,this->m_gridSize * this->m_gridSize * 6);
                          }
                          pRVar11 = gles31::Context::getRenderContext
                                              ((this->super_TestCase).m_context);
                          tcu::Surface::getAccess(&local_a0,(Surface *)&rnd.m_rnd.z);
                          glu::readPixels(pRVar11,0,0,&local_a0);
                          dVar4 = (**(code **)(lVar12 + 0x800))();
                          glu::checkError(dVar4,"render and read",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                                          ,0xf32);
                          bVar18 = verifyImage(this,(Surface *)&rnd.m_rnd.z);
                          if (bVar18) {
                            tcu::TestContext::setTestResult
                                      ((this->super_TestCase).super_TestCase.super_TestNode.
                                       m_testCtx,QP_TEST_RESULT_PASS,"Pass");
                          }
                          else {
                            tcu::TestContext::setTestResult
                                      ((this->super_TestCase).super_TestCase.super_TestNode.
                                       m_testCtx,QP_TEST_RESULT_FAIL,"Image verification failed");
                          }
                          de::Random::~Random((Random *)local_60);
                          tcu::Surface::~Surface((Surface *)&rnd.m_rnd.z);
                          return STOP;
                        }
                      }
                      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
                      tcu::TestError::TestError
                                (pTVar14,(char *)0x0,"color2Location != -1",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                                 ,0xf09);
                      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                    }
                  }
                  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar14,(char *)0x0,"color1Location != -1",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                             ,0xf08);
                  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
              }
              pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar14,(char *)0x0,"depthScaleLocation != -1",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                         ,0xf07);
              __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar14,(char *)0x0,"depthBiasLocation != -1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                     ,0xf06);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,"colLocation != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                 ,0xf05);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,(char *)0x0,"posLocation != -1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
             ,0xf04);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

DepthDrawCase::IterateResult DepthDrawCase::iterate (void)
{
	const bool				hasTessellation		= (m_state == STATE_PER_PRIMITIVE);
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLint		posLocation			= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glw::GLint		colLocation			= gl.getAttribLocation(m_program->getProgram(), "a_colorMix");
	const glw::GLint		depthBiasLocation	= gl.getUniformLocation(m_program->getProgram(), "u_depthBias");
	const glw::GLint		depthScaleLocation	= gl.getUniformLocation(m_program->getProgram(), "u_depthScale");
	const glw::GLint		color1Location		= gl.getUniformLocation(m_program->getProgram(), "u_color1");
	const glw::GLint		color2Location		= gl.getUniformLocation(m_program->getProgram(), "u_color2");

	tcu::Surface			viewport			(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	de::Random				rnd					(0x213237);

	TCU_CHECK(posLocation != -1);
	TCU_CHECK(colLocation != -1);
	TCU_CHECK(depthBiasLocation != -1);
	TCU_CHECK(depthScaleLocation != -1);
	TCU_CHECK(color1Location != -1);
	TCU_CHECK(color2Location != -1);

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clearDepthf(1.0f);
	gl.depthFunc(GL_LESS);
	gl.enable(GL_DEPTH_TEST);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup viewport");

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, (int)(8 * sizeof(float)), (const float*)DE_NULL);
	gl.vertexAttribPointer(colLocation, 4, GL_FLOAT, GL_FALSE, (int)(8 * sizeof(float)), (const float*)DE_NULL + 4);
	gl.enableVertexAttribArray(posLocation);
	gl.enableVertexAttribArray(colLocation);
	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup va");

	if (hasTessellation)
		gl.patchParameteri(GL_PATCH_VERTICES, 3);

	for (int layerNdx = 0; layerNdx < m_numLayers; ++layerNdx)
	{
		gl.uniform1f(depthBiasLocation, m_layers[layerNdx].zOffset);
		gl.uniform1f(depthScaleLocation, m_layers[layerNdx].zScale);
		gl.uniform4fv(color1Location, 1, m_layers[layerNdx].color1.getPtr());
		gl.uniform4fv(color2Location, 1, m_layers[layerNdx].color2.getPtr());

		if (m_state == STATE_GLOBAL)
		{
			const float negPadding = (m_bboxSize == BBOX_EQUAL) ? (0.0f) : (rnd.getFloat() * 0.3f);
			const float posPadding = (m_bboxSize == BBOX_EQUAL) ? (0.0f) : (rnd.getFloat() * 0.3f);

			gl.primitiveBoundingBox(-1.0f, -1.0f, m_layers[layerNdx].zOffset - negPadding, 1.0f,
									1.0f,  1.0f, (m_layers[layerNdx].zOffset + m_layers[layerNdx].zScale + posPadding), 1.0f);
		}

		gl.drawArrays((hasTessellation) ? (GL_PATCHES) : (GL_TRIANGLES), 0, m_gridSize * m_gridSize * 6);
	}

	glu::readPixels(m_context.getRenderContext(), 0, 0, viewport.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "render and read");

	if (verifyImage(viewport))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}